

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O0

pt_exec_mode pti_get_nominal_eosz(pt_ild *ild)

{
  int iVar1;
  pt_ild *ild_local;
  
  iVar1 = mode_64b(ild);
  if (iVar1 == 0) {
    ild_local._4_4_ = pti_get_nominal_eosz_non64(ild);
  }
  else if ((*(ushort *)&ild->field_0x10 >> 9 & 1) == 0) {
    if ((*(ushort *)&ild->field_0x10 & 1) == 0) {
      ild_local._4_4_ = ptem_32bit;
    }
    else {
      ild_local._4_4_ = ptem_16bit;
    }
  }
  else {
    ild_local._4_4_ = ptem_64bit;
  }
  return ild_local._4_4_;
}

Assistant:

static inline enum pt_exec_mode
pti_get_nominal_eosz(const struct pt_ild *ild)
{
	if (mode_64b(ild)) {
		if (ild->rex_w)
			return ptem_64bit;
		if (ild->osz)
			return ptem_16bit;
		return ptem_32bit;
	}
	return pti_get_nominal_eosz_non64(ild);
}